

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkImageWithMemory.hpp
# Opt level: O3

void __thiscall
vk::ImageWithMemory::ImageWithMemory
          (ImageWithMemory *this,DeviceInterface *vk,VkDevice device,Allocator *allocator,
          VkImageCreateInfo *imageCreateInfo,MemoryRequirement memoryRequirement)

{
  VkResult result;
  Move<vk::Handle<(vk::HandleType)9>_> local_78;
  undefined1 local_58 [24];
  VkAllocationCallbacks *pVStack_40;
  
  createImage(&local_78,vk,device,imageCreateInfo,(VkAllocationCallbacks *)0x0);
  local_58._16_8_ = local_78.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device;
  pVStack_40 = local_78.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator;
  local_58._0_8_ = local_78.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
  local_58._8_8_ =
       local_78.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface;
  (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       local_78.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device;
  (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       local_78.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator;
  (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal =
       local_78.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
  (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       local_78.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface;
  getImageMemoryRequirements
            ((VkMemoryRequirements *)local_58,vk,device,
             (VkImage)(this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                      m_internal);
  (*allocator->_vptr_Allocator[3])(&local_78,allocator,local_58,(ulong)memoryRequirement.m_flags);
  (this->m_allocation).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
  ptr = (Allocation *)
        local_78.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
  result = (*vk->_vptr_DeviceInterface[0xd])
                     (vk,device,
                      (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                      m_internal,
                      ((VkDeviceMemory *)
                      (local_78.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                       m_internal + 8))->m_internal,
                      *(VkDeviceSize *)
                       (local_78.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                        m_internal + 0x10));
  checkResult(result,
              "vk.bindImageMemory(device, *m_image, m_allocation->getMemory(), m_allocation->getOffset())"
              ,
              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkImageWithMemory.hpp"
              ,0x2f);
  return;
}

Assistant:

ImageWithMemory	(const vk::DeviceInterface&		vk,
														 const vk::VkDevice				device,
														 vk::Allocator&					allocator,
														 const vk::VkImageCreateInfo&	imageCreateInfo,
														 const vk::MemoryRequirement	memoryRequirement)

											: m_image		(createImage(vk, device, &imageCreateInfo))
											, m_allocation	(allocator.allocate(getImageMemoryRequirements(vk, device, *m_image), memoryRequirement))
										{
											VK_CHECK(vk.bindImageMemory(device, *m_image, m_allocation->getMemory(), m_allocation->getOffset()));
										}